

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void rdr_load(rdr_t *rdr,FILE *file)

{
  int iVar1;
  void *pvVar2;
  pat_t *ppVar3;
  FILE *in_RSI;
  byte *in_RDI;
  char *pat;
  char *in_stack_00000010;
  uint32_t p;
  fpos_t pos;
  int autouni;
  char *err;
  FILE *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  qrk_t *in_stack_ffffffffffffffd0;
  uint local_1c;
  char *local_18;
  FILE *local_10;
  byte *local_8;
  
  local_18 = "broken file, invalid reader format";
  local_1c = (uint)(*in_RDI & 1);
  local_10 = in_RSI;
  local_8 = in_RDI;
  fgetpos(in_RSI,(fpos_t *)&stack0xffffffffffffffd0);
  iVar1 = __isoc99_fscanf(local_10,"#rdr#%u/%u/%d\n",local_8 + 4,local_8 + 0x10,&local_1c);
  if (iVar1 != 3) {
    fsetpos(local_10,(fpos_t *)&stack0xffffffffffffffd0);
    iVar1 = __isoc99_fscanf(local_10,"#rdr#%u/%u\n",local_8 + 4,local_8 + 0x10);
    if (iVar1 != 2) {
      fatal(local_18);
    }
  }
  *local_8 = local_1c != 0;
  local_8[0xc] = 0;
  local_8[0xd] = 0;
  local_8[0xe] = 0;
  local_8[0xf] = 0;
  local_8[8] = 0;
  local_8[9] = 0;
  local_8[10] = 0;
  local_8[0xb] = 0;
  if (*(int *)(local_8 + 4) != 0) {
    pvVar2 = xmalloc((size_t)in_stack_ffffffffffffffc0);
    *(void **)(local_8 + 0x18) = pvVar2;
    for (in_stack_ffffffffffffffcc = 0; in_stack_ffffffffffffffcc < *(uint *)(local_8 + 4);
        in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1) {
      in_stack_ffffffffffffffc0 = (FILE *)ns_readstr(in_stack_ffffffffffffffc0);
      ppVar3 = pat_comp(in_stack_00000010);
      *(pat_t **)(*(long *)(local_8 + 0x18) + (ulong)in_stack_ffffffffffffffcc * 8) = ppVar3;
      iVar1 = tolower((int)(char)in_stack_ffffffffffffffc0->_flags);
      if (iVar1 == 0x2a) {
        *(int *)(local_8 + 8) = *(int *)(local_8 + 8) + 1;
        *(int *)(local_8 + 0xc) = *(int *)(local_8 + 0xc) + 1;
      }
      else if (iVar1 == 0x62) {
        *(int *)(local_8 + 0xc) = *(int *)(local_8 + 0xc) + 1;
      }
      else if (iVar1 == 0x75) {
        *(int *)(local_8 + 8) = *(int *)(local_8 + 8) + 1;
      }
    }
  }
  qrk_load(in_stack_ffffffffffffffd0,
           (FILE *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  qrk_load(in_stack_ffffffffffffffd0,
           (FILE *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void rdr_load(rdr_t *rdr, FILE *file) {
	const char *err = "broken file, invalid reader format";
	int autouni = rdr->autouni;
	fpos_t pos;
	fgetpos(file, &pos);
	if (fscanf(file, "#rdr#%"PRIu32"/%"PRIu32"/%d\n",
			&rdr->npats, &rdr->ntoks, &autouni) != 3) {
		// This for compatibility with previous file format
		fsetpos(file, &pos);
		if (fscanf(file, "#rdr#%"PRIu32"/%"PRIu32"\n",
				&rdr->npats, &rdr->ntoks) != 2)
			fatal(err);
	}
	rdr->autouni = autouni;
	rdr->nuni = rdr->nbi = 0;
	if (rdr->npats != 0) {
		rdr->pats = xmalloc(sizeof(pat_t *) * rdr->npats);
		for (uint32_t p = 0; p < rdr->npats; p++) {
			char *pat = ns_readstr(file);
			rdr->pats[p] = pat_comp(pat);
			switch (tolower(pat[0])) {
				case 'u': rdr->nuni++; break;
				case 'b': rdr->nbi++;  break;
				case '*': rdr->nuni++;
				          rdr->nbi++;  break;
			}
		}
	}
	qrk_load(rdr->lbl, file);
	qrk_load(rdr->obs, file);
}